

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::serializeCollisionObjects(cbtCollisionWorld *this,cbtSerializer *serializer)

{
  cbtCollisionObject *pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  cbtCollisionShape *shape;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> serializedShapes;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_c0;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_b8;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> local_b0;
  
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (cbtCollisionShape **)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (cbtHashPtr *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  if (0 < (this->m_collisionObjects).m_size) {
    lVar4 = 0;
    do {
      local_c0 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
                 (this->m_collisionObjects).m_data[lVar4]->m_collisionShape;
      local_b8 = local_c0;
      iVar2 = cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::findIndex
                        (&local_b0,(cbtHashPtr *)&local_b8);
      if ((iVar2 == -1) || (local_b0.m_valueArray.m_data == (cbtCollisionShape **)0x0)) {
        local_b8.m_pointer = local_c0.m_pointer;
        cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::insert
                  (&local_b0,(cbtHashPtr *)&local_b8,(cbtCollisionShape **)&local_c0.m_pointer);
        (**(code **)(*local_c0.m_pointer + 0x78))(local_c0.m_pointer,serializer);
      }
      iVar2 = (this->m_collisionObjects).m_size;
      uVar3 = (ulong)iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)uVar3);
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pcVar1 = (this->m_collisionObjects).m_data[lVar4];
        if (pcVar1->m_internalType == 1) {
          (*pcVar1->_vptr_cbtCollisionObject[6])(pcVar1,serializer);
          uVar3 = (ulong)(uint)(this->m_collisionObjects).m_size;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)uVar3);
    }
  }
  cbtAlignedObjectArray<cbtHashPtr>::~cbtAlignedObjectArray(&local_b0.m_keyArray);
  cbtAlignedObjectArray<cbtCollisionShape_*>::~cbtAlignedObjectArray(&local_b0.m_valueArray);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_b0.m_next);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_b0.m_hashTable);
  return;
}

Assistant:

void cbtCollisionWorld::serializeCollisionObjects(cbtSerializer* serializer)
{
	int i;

	///keep track of shapes already serialized
	cbtHashMap<cbtHashPtr, cbtCollisionShape*> serializedShapes;

	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* colObj = m_collisionObjects[i];
		cbtCollisionShape* shape = colObj->getCollisionShape();

		if (!serializedShapes.find(shape))
		{
			serializedShapes.insert(shape, shape);
			shape->serializeSingleShape(serializer);
		}
	}

	//serialize all collision objects
	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* colObj = m_collisionObjects[i];
		if (colObj->getInternalType() == cbtCollisionObject::CO_COLLISION_OBJECT)
		{
			colObj->serializeSingleObject(serializer);
		}
	}
}